

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O1

clock_variables_t *
tchecker::clock_variables
          (clock_variables_t *__return_storage_ptr__,reference_clock_variables_t *refclocks,
          clock_variables_t *clocks)

{
  long lVar1;
  stored_size_type sVar2;
  invalid_argument *piVar3;
  uint uVar4;
  long lVar5;
  pointer local_38;
  
  uVar4 = 0;
  memset(__return_storage_ptr__,0,0xa0);
  if (refclocks->_refcount != 0) {
    do {
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_38,(key_type *)refclocks);
      if (local_38 ==
          (pointer)(*(stored_size_type *)
                     ((long)&(refclocks->super_flat_clock_variables_t).
                             super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._index._key_map.m_flat_tree.m_data + 8) * 0x28 +
                   *(long *)&(refclocks->super_flat_clock_variables_t).
                             super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._index._key_map.m_flat_tree.m_data)) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar3,"unknown variable ID");
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      if (local_38 == (pointer)0x0) goto LAB_0014eddf;
      clock_variables_t::declare(__return_storage_ptr__,&local_38->second,1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < refclocks->_refcount);
  }
  sVar2 = *(stored_size_type *)
           ((long)&(clocks->
                   super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).
                   super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._index._key_map.m_flat_tree.m_data + 8);
  if (sVar2 != 0) {
    lVar5 = *(long *)&(clocks->
                      super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).
                      super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._index._key_map.m_flat_tree.m_data;
    lVar1 = lVar5 + sVar2 * 0x28;
    do {
      if (lVar5 == 0) {
LAB_0014eddf:
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<std::pair<unsigned int, std::basic_string<char>> *, true>::operator*() const [Pointer = std::pair<unsigned int, std::basic_string<char>> *, IsConst = true]"
                     );
      }
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>_>_>
      ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_tchecker::clock_info_t>_>_>
              *)&local_38,
             (key_type *)
             &(clocks->
              super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).
              super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._info);
      if (local_38 ==
          (pointer)((clocks->
                    super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).
                    super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._info.m_flat_tree.m_data.m_seq.m_holder.m_start +
                   *(stored_size_type *)
                    ((long)&(clocks->
                            super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ).
                            super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._info.m_flat_tree.m_data.m_seq + 8))) {
        piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar3,"unknown variable ID");
        __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      clock_variables_t::declare
                (__return_storage_ptr__,(string *)(lVar5 + 8),
                 (((clock_info_t *)&local_38->field_0x4)->super_size_info_t)._size);
      lVar5 = lVar5 + 0x28;
    } while (lVar5 != lVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_variables_t clock_variables(tchecker::reference_clock_variables_t const & refclocks,
                                            tchecker::clock_variables_t const & clocks)
{
  tchecker::clock_variables_t clockvars;

  // declare reference clocks
  for (tchecker::clock_id_t id = 0; id < refclocks.refcount(); ++id)
    clockvars.declare(refclocks.name(id), 1);

  // declare clocks
  for (auto && [id, name] : clocks.index())
    clockvars.declare(name, clocks.info(id).size());

  return clockvars;
}